

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O0

int __thiscall pg::PSISolver::mark_solved_seq(PSISolver *this)

{
  long lVar1;
  undefined4 local_18;
  undefined4 local_14;
  int n;
  int res;
  PSISolver *this_local;
  
  local_14 = 0;
  local_18 = 0;
  while( true ) {
    lVar1 = Solver::nodecount(&this->super_Solver);
    if (lVar1 <= local_18) break;
    if (*(int *)(done + (long)local_18 * 4) == 2) {
      *(undefined4 *)(won + (long)local_18 * 4) = 1;
      *(undefined4 *)(done + (long)local_18 * 4) = 3;
      local_14 = local_14 + 1;
    }
    local_18 = local_18 + 1;
  }
  return local_14;
}

Assistant:

int
PSISolver::mark_solved_seq(void)
{
    int res = 0;
    for (int n=0; n<nodecount(); n++) {
        if (done[n] == 2) { // done[n] == 3 proxies disabled and won
            won[n] = 1;
            done[n] = 3; // mark as won
            res++;
        }
    }
    return res;
}